

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

bool __thiscall
andres::
BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<int,int,int>>
::overlaps<int,false,std::allocator<unsigned_long>>
          (BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<int,int,int>>
           *this,View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  reference piVar5;
  reference piVar6;
  void *dataPointer_;
  void *vDataPointer_;
  void *dataPointer__1;
  
  pVVar1 = *(View<int,_true,_std::allocator<unsigned_long>_> **)this;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  piVar2 = pVVar1->data_;
  if ((piVar2 != (pointer)0x0) && (piVar3 = v->data_, piVar3 != (pointer)0x0)) {
    piVar5 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       (pVVar1,(pVVar1->geometry_).size_ - 1);
    piVar6 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((piVar2 <= piVar3) && (piVar3 <= piVar5)) {
      return true;
    }
    if ((piVar3 <= piVar2) && (piVar2 <= piVar6)) {
      return true;
    }
  }
  pVVar1 = *(View<int,_true,_std::allocator<unsigned_long>_> **)(this + 8);
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  piVar2 = pVVar1->data_;
  if ((piVar2 == (pointer)0x0) || (piVar3 = v->data_, piVar3 == (pointer)0x0)) {
    bVar4 = false;
  }
  else {
    piVar5 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       (pVVar1,(pVVar1->geometry_).size_ - 1);
    piVar6 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((piVar3 < piVar2) || (bVar4 = true, piVar5 < piVar3)) {
      bVar4 = piVar2 <= piVar6 && piVar3 <= piVar2;
    }
  }
  return bVar4;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e1_.overlaps(v) || e2_.overlaps(v); }